

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeResume
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,HeapType type,
          vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
          *resumetable)

{
  optional<unsigned_int> *__args;
  pointer pOVar1;
  char *pcVar2;
  Result<wasm::Ok> *pRVar3;
  ParseDefsCtx *this_00;
  OnClauseInfo *info;
  pointer __args_00;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_b8;
  HeapType local_90;
  Result<wasm::Ok> *local_88;
  ParseDefsCtx *local_80;
  undefined1 auStack_78 [8];
  vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> labels;
  undefined1 auStack_58 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> tags;
  
  tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  labels.
  super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  labels.
  super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.id = type.id;
  local_88 = __return_storage_ptr__;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
             ((long)(resumetable->
                    super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(resumetable->
                    super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::reserve
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             auStack_78,
             ((long)(resumetable->
                    super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(resumetable->
                    super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  __args_00 = (resumetable->
              super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (resumetable->
           super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_80 = this;
  if (__args_00 != pOVar1) {
    __args = (optional<unsigned_int> *)
             ((long)&tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4);
    do {
      if (tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start ==
          tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                  ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_58,
                   (iterator)
                   tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start,&__args_00->tag);
      }
      else {
        pcVar2 = (__args_00->tag).super_IString.str._M_str;
        ((tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start)->super_IString).str._M_len =
             (__args_00->tag).super_IString.str._M_len;
        ((tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar2;
        tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start =
             tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      if (__args_00->isOnSwitch == true) {
        std::vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>::
        emplace_back<std::optional<unsigned_int>>
                  ((vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>
                    *)auStack_78,__args);
      }
      else {
        tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = __args_00->label;
        std::vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>::
        emplace_back<std::optional<unsigned_int>>
                  ((vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>
                    *)auStack_78,__args);
      }
      __args_00 = __args_00 + 1;
    } while (__args_00 != pOVar1);
  }
  this_00 = local_80;
  IRBuilder::makeResume
            ((Result<wasm::Ok> *)&local_b8,&local_80->irBuilder,local_90,
             (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
             (vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             auStack_78);
  pRVar3 = local_88;
  withLoc<wasm::Ok>(local_88,this_00,pos,(Result<wasm::Ok> *)&local_b8);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            (&local_b8);
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,
                    (long)labels.
                          super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)tags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return pRVar3;
}

Assistant:

Result<> makeResume(Index pos,
                      const std::vector<Annotation>& annotations,
                      HeapType type,
                      const std::vector<OnClauseInfo>& resumetable) {
    std::vector<Name> tags;
    std::vector<std::optional<Index>> labels;
    tags.reserve(resumetable.size());
    labels.reserve(resumetable.size());
    for (const OnClauseInfo& info : resumetable) {
      tags.push_back(info.tag);
      if (info.isOnSwitch) {
        labels.push_back(std::nullopt);
      } else {
        labels.push_back(std::optional<Index>(info.label));
      }
    }
    return withLoc(pos, irBuilder.makeResume(type, tags, labels));
  }